

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::transmitDelayedMessages(CommonCore *this)

{
  _Optional_payload_base<helics::ActionMessage> local_1a0;
  _Optional_payload_base<helics::ActionMessage> local_e0;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            ((optional<helics::ActionMessage> *)&local_1a0,&this->delayTransmitQueue);
  if (local_1a0._M_engaged == true) {
    do {
      if ((local_1a0._M_payload._M_value.source_id.gid == 0) ||
         (local_1a0._M_payload._M_value.source_id.gid == -0x396fe)) {
        local_1a0._M_payload._M_value.source_id.gid =
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid;
      }
      routeMessage(this,(ActionMessage *)&local_1a0);
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
                ((optional<helics::ActionMessage> *)&local_e0,&this->delayTransmitQueue);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1a0,&local_e0);
      if (local_e0._M_engaged == true) {
        local_e0._M_engaged = false;
        ActionMessage::~ActionMessage((ActionMessage *)&local_e0);
      }
    } while (local_1a0._M_engaged != false);
  }
  return;
}

Assistant:

void CommonCore::transmitDelayedMessages()
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if (msg->source_id == parent_broker_id || msg->source_id == gDirectCoreId) {
            msg->source_id = global_broker_id_local;
        }
        routeMessage(*msg);
        msg = delayTransmitQueue.pop();
    }
}